

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

void __thiscall
google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
          (InternalMetadata *this)

{
  int iVar1;
  SooRep *this_00;
  
  if ((this->ptr_ & 1U) == 0) {
    this_00 = (SooRep *)mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this);
  }
  else {
    this_00 = (SooRep *)((this->ptr_ & 0xfffffffffffffffeU) + 8);
  }
  iVar1 = SooRep::size(this_00,(undefined1  [16])
                               ((undefined1  [16])this_00->field_0 & (undefined1  [16])0x4) ==
                               (undefined1  [16])0x0);
  if (iVar1 != 0) {
    UnknownFieldSet::ClearFallback((UnknownFieldSet *)this_00);
    return;
  }
  return;
}

Assistant:

PROTOBUF_ALWAYS_INLINE bool HasUnknownFieldsTag() const {
    return ptr_ & kUnknownFieldsTagMask;
  }